

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfunc.cpp
# Opt level: O3

int __thiscall CVmFuncPtr::get_fnptr(CVmFuncPtr *this,vm_val_t *v)

{
  uchar *p;
  uchar *puVar1;
  vm_obj_id_t vVar2;
  int iVar3;
  size_t *psVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  p = this->p_;
  if (G_code_pool_X.super_CVmPoolPaged.page_slots_ != 0) {
    psVar4 = &(G_code_pool_X.super_CVmPoolPaged.pages_)->siz;
    iVar3 = -(int)p;
    bVar6 = true;
    uVar5 = 1;
    do {
      puVar1 = (uchar *)((CVmPool_pg *)(psVar4 + -1))->mem;
      if ((puVar1 <= p) && (p < puVar1 + *psVar4)) {
        if (bVar6) {
          v->typ = VM_FUNCPTR;
          (v->val).obj = -((int)puVar1 + iVar3);
          goto LAB_0029098b;
        }
        break;
      }
      bVar6 = uVar5 < G_code_pool_X.super_CVmPoolPaged.page_slots_;
      psVar4 = psVar4 + 2;
      iVar3 = iVar3 - G_code_pool_X.super_CVmPoolPaged._8_4_;
      bVar7 = uVar5 != G_code_pool_X.super_CVmPoolPaged.page_slots_;
      uVar5 = uVar5 + 1;
    } while (bVar7);
  }
  vVar2 = CVmDynamicFunc::get_obj_from_prefix(p);
  if (vVar2 == 0) {
    v->typ = VM_NIL;
    iVar3 = 0;
  }
  else {
    v->typ = VM_OBJ;
    (v->val).obj = vVar2;
LAB_0029098b:
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int CVmFuncPtr::get_fnptr(VMG_ vm_val_t *v)
{
    /* 
     *   Try translating the method address to a code pool offset.  If that
     *   succeeds, it's a regular static function.  
     */
    pool_ofs_t entry_ofs;
    if (G_code_pool->get_ofs((const char *)p_, &entry_ofs))
    {
        /* it's a regular function call */
        v->set_fnptr(entry_ofs);
        return TRUE;
    }

    /* 
     *   It's not a static function pointer, so it must be a dynamic
     *   function.  A DynamicFunc stores a prefix header before the start of
     *   our method header, containing the DynamicFunc object ID.  Read the
     *   object ID, and return it as a VM_OBJ value.  
     */
    vm_obj_id_t obj = CVmDynamicFunc::get_obj_from_prefix(vmg_ p_);
    if (obj != VM_INVALID_OBJ)
    {
        v->set_obj(obj);
        return TRUE;
    }

    /* we couldn't find any valid object */
    v->set_nil();
    return FALSE;
}